

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_output_key
          (psa_key_attributes_t *attributes,psa_key_derivation_operation_t *operation,
          psa_key_handle_t *handle)

{
  size_t sVar1;
  psa_se_drv_table_entry_t *local_40;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *slot;
  psa_key_handle_t *ppStack_28;
  psa_status_t status;
  psa_key_handle_t *handle_local;
  psa_key_derivation_operation_t *operation_local;
  psa_key_attributes_t *attributes_local;
  
  driver = (psa_se_drv_table_entry_t *)0x0;
  local_40 = (psa_se_drv_table_entry_t *)0x0;
  ppStack_28 = handle;
  handle_local = (psa_key_handle_t *)operation;
  operation_local = (psa_key_derivation_operation_t *)attributes;
  sVar1 = psa_get_key_bits(attributes);
  if (sVar1 == 0) {
    attributes_local._4_4_ = -0x87;
  }
  else if ((handle_local[2] & 1) == 0) {
    attributes_local._4_4_ = -0x85;
  }
  else {
    slot._4_4_ = psa_start_key_creation
                           (PSA_KEY_CREATION_DERIVE,(psa_key_attributes_t *)operation_local,
                            ppStack_28,(psa_key_slot_t **)&driver,&local_40);
    if (slot._4_4_ == 0) {
      slot._4_4_ = psa_generate_derived_key_internal
                             ((psa_key_slot_t *)driver,
                              (ulong)*(ushort *)((long)&operation_local->alg + 2),
                              (psa_key_derivation_operation_t *)handle_local);
    }
    if (slot._4_4_ == 0) {
      slot._4_4_ = psa_finish_key_creation((psa_key_slot_t *)driver,local_40);
    }
    if (slot._4_4_ != 0) {
      psa_fail_key_creation((psa_key_slot_t *)driver,local_40);
      *ppStack_28 = 0;
    }
    attributes_local._4_4_ = slot._4_4_;
  }
  return attributes_local._4_4_;
}

Assistant:

psa_status_t psa_key_derivation_output_key( const psa_key_attributes_t *attributes,
                                       psa_key_derivation_operation_t *operation,
                                       psa_key_handle_t *handle )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;
    psa_se_drv_table_entry_t *driver = NULL;

    /* Reject any attempt to create a zero-length key so that we don't
     * risk tripping up later, e.g. on a malloc(0) that returns NULL. */
    if( psa_get_key_bits( attributes ) == 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    if( ! operation->can_output_key )
        return( PSA_ERROR_NOT_PERMITTED );

    status = psa_start_key_creation( PSA_KEY_CREATION_DERIVE,
                                     attributes, handle, &slot, &driver );
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        /* Deriving a key in a secure element is not implemented yet. */
        status = PSA_ERROR_NOT_SUPPORTED;
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    if( status == PSA_SUCCESS )
    {
        status = psa_generate_derived_key_internal( slot,
                                                    attributes->core.bits,
                                                    operation );
    }
    if( status == PSA_SUCCESS )
        status = psa_finish_key_creation( slot, driver );
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( slot, driver );
        *handle = 0;
    }
    return( status );
}